

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::sr::anon_unknown_0::TextureSizeInstance::iterate
          (TestStatus *__return_storage_ptr__,TextureSizeInstance *this)

{
  vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
  *this_00;
  ostringstream *poVar1;
  ulong uVar2;
  TestSize *textureSize;
  uint uVar3;
  TextureFormat TVar4;
  TextureSpec *pTVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  long lVar9;
  bool bVar10;
  uint uVar11;
  long lVar12;
  MessageBuilder *pMVar13;
  ulong uVar14;
  int iVar15;
  IVec3 *textureSize_00;
  DataType dataType;
  ulong uVar16;
  IVec4 output;
  TextureBindingSp textureBinding;
  stringstream resultSizeStr;
  ostringstream local_8b8 [8];
  ostream local_8b0 [376];
  undefined1 *local_738 [26];
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  MessageBuilder local_1b0;
  
  local_738[0] = (undefined1 *)0x200000001;
  local_738[1] = (undefined1 *)0x1;
  local_738[2] = (undefined1 *)0x100000000;
  local_738[3] = (undefined1 *)0x100000002;
  local_738[4] = (undefined1 *)0x200000001;
  local_738[5] = (undefined1 *)0x100000001;
  local_738[6] = (undefined1 *)0x100000000;
  local_738[7] = (undefined1 *)0x100000001;
  local_738[8] = (undefined1 *)0x300000001;
  local_738[9] = (undefined1 *)0x2;
  local_738[10] = (undefined1 *)0x100000000;
  local_738[0xb] = (undefined1 *)0x200000003;
  local_738[0xc] = (undefined1 *)0x300000001;
  local_738[0xd] = (undefined1 *)0x100000002;
  local_738[0xe] = (undefined1 *)0x100000000;
  local_738[0xf] = (undefined1 *)0x100000001;
  local_738[0x10] = (undefined1 *)0x1f00000064;
  local_738[0x11] = (undefined1 *)0x12;
  local_738[0x12] = (undefined1 *)0x6400000000;
  local_738[0x13] = (undefined1 *)0x120000001f;
  local_738[0x14] = (undefined1 *)0x1f00000064;
  local_738[0x15] = (undefined1 *)0x100000012;
  local_738[0x16] = (undefined1 *)0x3200000000;
  local_738[0x17] = (undefined1 *)0x90000000f;
  local_738[0x18] = (undefined1 *)0x1f00000064;
  local_738[0x19] = &DAT_200000012;
  local_668 = 0x1900000000;
  uStack_660 = 0x400000007;
  local_658 = 0x1f00000064;
  uStack_650 = 0x300000012;
  local_648 = 0xc00000000;
  uStack_640 = 0x200000003;
  local_638 = 0x1f00000064;
  uStack_630 = 0x400000012;
  local_628 = 0x600000000;
  uStack_620 = 0x100000001;
  local_618 = 0x1f00000064;
  uStack_610 = 0x500000012;
  local_608 = 0x300000000;
  uStack_600 = 0x100000001;
  local_5f8 = 0x1f00000064;
  uStack_5f0 = 0x600000012;
  local_5e8 = 0x100000000;
  uStack_5e0 = 0x100000001;
  local_5d8 = 0x8000000064;
  uStack_5d0 = 0x20;
  local_5c8 = 0x6400000000;
  uStack_5c0 = 0x2000000080;
  local_5b8 = 0x8000000064;
  uStack_5b0 = 0x100000020;
  local_5a8 = 0x3200000000;
  uStack_5a0 = 0x1000000040;
  local_598 = 0x8000000064;
  uStack_590 = 0x200000020;
  local_588 = 0x1900000000;
  uStack_580 = 0x800000020;
  local_578 = 0x8000000064;
  uStack_570 = 0x300000020;
  local_568 = 0xc00000000;
  uStack_560 = 0x400000010;
  local_558 = 0x8000000064;
  uStack_550 = 0x400000020;
  local_548 = 0x600000000;
  uStack_540 = 0x200000008;
  local_538 = 0x8000000064;
  uStack_530 = 0x500000020;
  local_528 = 0x300000000;
  uStack_520 = 0x100000004;
  local_518 = 0x8000000064;
  uStack_510 = 0x600000020;
  local_508 = 0x100000000;
  uStack_500 = 0x100000002;
  local_4f8 = 0x8000000064;
  uStack_4f0 = 0x700000020;
  local_4e8 = 0x100000000;
  uStack_4e0 = 0x100000001;
  local_4d8 = 0x4000000080;
  uStack_4d0 = 0x20;
  local_4c8 = 0x8000000000;
  uStack_4c0 = 0x2000000040;
  local_4b8 = 0x4000000080;
  uStack_4b0 = 0x100000020;
  local_4a8 = 0x4000000000;
  uStack_4a0 = 0x1000000020;
  local_498 = 0x4000000080;
  uStack_490 = 0x200000020;
  local_488 = 0x2000000000;
  uStack_480 = 0x800000010;
  local_478 = 0x4000000080;
  uStack_470 = 0x300000020;
  local_468 = 0x1000000000;
  uStack_460 = 0x400000008;
  local_458 = 0x4000000080;
  uStack_450 = 0x400000020;
  local_448 = 0x800000000;
  uStack_440 = 0x200000004;
  local_438 = 0x4000000080;
  uStack_430 = 0x500000020;
  local_428 = 0x400000000;
  uStack_420 = 0x100000002;
  local_418 = 0x4000000080;
  uStack_410 = 0x600000020;
  local_408 = 0x200000000;
  uStack_400 = 0x100000001;
  local_3f8 = 0x4000000080;
  uStack_3f0 = 0x700000020;
  local_3e8 = 0x100000000;
  uStack_3e0 = 0x100000001;
  local_3d8 = 0x100000001;
  uStack_3d0 = 1;
  local_3c8 = 0x100000000;
  uStack_3c0 = 0x100000001;
  local_3b8 = 0x4000000040;
  uStack_3b0 = 0x40;
  local_3a8 = 0x4000000000;
  uStack_3a0 = 0x4000000040;
  local_398 = 0x4000000040;
  uStack_390 = 0x100000040;
  local_388 = 0x2000000000;
  uStack_380 = 0x2000000020;
  local_378 = 0x4000000040;
  uStack_370 = 0x200000040;
  local_368 = 0x1000000000;
  uStack_360 = 0x1000000010;
  local_358 = 0x4000000040;
  uStack_350 = 0x300000040;
  local_348 = 0x800000000;
  uStack_340 = 0x800000008;
  local_338 = 0x4000000040;
  uStack_330 = 0x400000040;
  local_328 = 0x400000000;
  uStack_320 = 0x400000004;
  local_318 = 0x1f00000064;
  uStack_310 = 0x300000012;
  local_308 = 0x600000001;
  uStack_300 = 0x100000001;
  local_2f8 = 0x4000000080;
  uStack_2f0 = 0x300000020;
  local_2e8 = 0x800000001;
  uStack_2e0 = 0x200000004;
  local_2d8 = 0x4000000040;
  uStack_2d0 = 0x100000040;
  local_2c8 = 0x1000000001;
  uStack_2c0 = 0x1000000010;
  local_2b8 = 0x100000001;
  uStack_2b0 = 6;
  local_2a8 = 0x100000000;
  uStack_2a0 = 0x600000001;
  local_298 = 0x2000000020;
  uStack_290 = 0xc;
  local_288 = 0x2000000000;
  uStack_280 = 0xc00000020;
  local_278 = 0x2000000020;
  uStack_270 = 0xc;
  local_268 = 0x1000000001;
  uStack_260 = 0x600000010;
  local_258 = 0x2000000020;
  uStack_250 = 0x10000000c;
  local_248 = 0x1000000000;
  uStack_240 = 0x600000010;
  local_238 = 0x2000000020;
  uStack_230 = 0x20000000c;
  local_228 = 0x800000000;
  uStack_220 = 0x300000008;
  local_218 = 0x2000000020;
  uStack_210 = 0x30000000c;
  local_208 = 0x400000000;
  uStack_200 = 0x100000004;
  local_1f8 = 0x2000000020;
  uStack_1f0 = 0x40000000c;
  local_1e8 = 0x200000000;
  uStack_1e0 = 0x100000002;
  local_1d8 = 0x2000000020;
  uStack_1d0 = 0x50000000c;
  local_1c8 = 0x100000000;
  uStack_1c0 = 0x100000001;
  lVar12 = (long)this->m_iterationCounter;
  iVar15 = this->m_iterationCounter + 1;
  this->m_iterationCounter = iVar15;
  if (iVar15 == 0x2d) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&resultSizeStr,"Pass",(allocator<char> *)&local_1b0);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&resultSizeStr);
    goto LAB_006216f8;
  }
  textureSize = &this->m_testSize;
  puVar6 = local_738[lVar12 * 4];
  puVar7 = local_738[lVar12 * 4 + 1];
  puVar8 = local_738[lVar12 * 4 + 3];
  *(undefined1 **)&(this->m_testSize).lodBase = local_738[lVar12 * 4 + 2];
  *(undefined1 **)((this->m_testSize).expectedSize.m_data + 1) = puVar8;
  *(undefined1 **)(this->m_testSize).textureSize.m_data = puVar6;
  *(undefined1 **)((this->m_testSize).textureSize.m_data + 2) = puVar7;
  TVar4 = (TextureFormat)
          ((this->super_TextureQueryInstance).super_ShaderRenderCaseInstance.super_TestInstance.
          m_context)->m_testCtx->m_log;
  iVar15 = (this->m_testSize).lod;
  uVar3 = (this->m_testSize).lodBase;
  textureSize_00 = (IVec3 *)(ulong)uVar3;
  bVar10 = isValidCase(((this->super_TextureQueryInstance).m_textureSpec)->type,
                       &textureSize->textureSize,iVar15,uVar3);
  if (!bVar10) goto LAB_00621f60;
  textureBinding.m_ptr = (TextureBinding *)0x0;
  textureBinding.m_state = (SharedPtrStateBase *)0x0;
  _resultSizeStr = TVar4;
  std::__cxx11::ostringstream::ostringstream(local_8b8);
  std::operator<<((ostream *)local_8b8,"Testing image size ");
  sr::(anonymous_namespace)::getTextureSizeString_abi_cxx11_
            ((string *)&local_1b0,
             (_anonymous_namespace_ *)
             (ulong)((this->super_TextureQueryInstance).m_textureSpec)->type,
             (TextureType)textureSize,textureSize_00);
  std::operator<<((ostream *)local_8b8,(string *)&local_1b0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&resultSizeStr,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_8b8);
  _resultSizeStr = TVar4;
  std::__cxx11::ostringstream::ostringstream(local_8b8);
  std::operator<<((ostream *)local_8b8,"Lod: ");
  pMVar13 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&resultSizeStr,&(this->m_testSize).lod);
  std::operator<<((ostream *)&pMVar13->m_str,", base level: ");
  pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&(this->m_testSize).lodBase);
  tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_8b8);
  switch(((this->super_TextureQueryInstance).m_textureSpec)->type) {
  case TEXTURETYPE_1D:
    _resultSizeStr = TVar4;
    std::__cxx11::ostringstream::ostringstream(local_8b8);
    std::operator<<((ostream *)local_8b8,"Expecting: ");
    pMVar13 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&resultSizeStr,(this->m_testSize).expectedSize.m_data);
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEXTURETYPE_2D:
    _resultSizeStr = TVar4;
    std::__cxx11::ostringstream::ostringstream(local_8b8);
    std::operator<<((ostream *)local_8b8,"Expecting: ");
    pMVar13 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&resultSizeStr,(this->m_testSize).expectedSize.m_data);
    std::operator<<((ostream *)&pMVar13->m_str,"x");
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(this->m_testSize).expectedSize.m_data + 1);
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEXTURETYPE_3D:
    _resultSizeStr = TVar4;
    std::__cxx11::ostringstream::ostringstream(local_8b8);
    std::operator<<((ostream *)local_8b8,"Expecting: ");
    pMVar13 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&resultSizeStr,(this->m_testSize).expectedSize.m_data);
    std::operator<<((ostream *)&pMVar13->m_str,"x");
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(this->m_testSize).expectedSize.m_data + 1);
    std::operator<<((ostream *)&pMVar13->m_str,"x");
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(this->m_testSize).expectedSize.m_data + 2);
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEXTURETYPE_CUBE_MAP:
    _resultSizeStr = TVar4;
    std::__cxx11::ostringstream::ostringstream(local_8b8);
    std::operator<<((ostream *)local_8b8,"Expecting: ");
    pMVar13 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&resultSizeStr,(this->m_testSize).expectedSize.m_data);
    std::operator<<((ostream *)&pMVar13->m_str,"x");
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(this->m_testSize).expectedSize.m_data + 1);
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEXTURETYPE_1D_ARRAY:
    _resultSizeStr = TVar4;
    std::__cxx11::ostringstream::ostringstream(local_8b8);
    std::operator<<((ostream *)local_8b8,"Expecting: ");
    pMVar13 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&resultSizeStr,(this->m_testSize).expectedSize.m_data);
    std::operator<<((ostream *)&pMVar13->m_str," and ");
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(this->m_testSize).textureSize.m_data + 2);
    std::operator<<((ostream *)&pMVar13->m_str," layer(s)");
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEXTURETYPE_2D_ARRAY:
    _resultSizeStr = TVar4;
    std::__cxx11::ostringstream::ostringstream(local_8b8);
    std::operator<<((ostream *)local_8b8,"Expecting: ");
    pMVar13 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&resultSizeStr,(this->m_testSize).expectedSize.m_data);
    std::operator<<((ostream *)&pMVar13->m_str,"x");
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(this->m_testSize).expectedSize.m_data + 1);
    std::operator<<((ostream *)&pMVar13->m_str," and ");
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(this->m_testSize).textureSize.m_data + 2);
    std::operator<<((ostream *)&pMVar13->m_str," layer(s)");
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEXTURETYPE_CUBE_ARRAY:
    _resultSizeStr = TVar4;
    std::__cxx11::ostringstream::ostringstream(local_8b8);
    std::operator<<((ostream *)local_8b8,"Expecting: ");
    pMVar13 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&resultSizeStr,(this->m_testSize).expectedSize.m_data);
    std::operator<<((ostream *)&pMVar13->m_str,"x");
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(this->m_testSize).expectedSize.m_data + 1);
    poVar1 = &pMVar13->m_str;
    std::operator<<((ostream *)poVar1," and ");
    std::ostream::operator<<(poVar1,(this->m_testSize).textureSize.m_data[2] / 6);
    std::operator<<((ostream *)poVar1," cube(s)");
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  default:
    goto switchD_00621878_default;
  }
  std::__cxx11::ostringstream::~ostringstream(local_8b8);
switchD_00621878_default:
  pTVar5 = (this->super_TextureQueryInstance).m_textureSpec;
  createEmptyTexture((anon_unknown_0 *)&resultSizeStr,pTVar5->format,pTVar5->type,
                     &textureSize->textureSize,iVar15 + uVar3 + 1,(this->m_testSize).lodBase,
                     &pTVar5->sampler);
  de::SharedPtr<vkt::sr::TextureBinding>::operator=
            (&textureBinding,(SharedPtr<vkt::sr::TextureBinding> *)&resultSizeStr);
  de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr
            ((SharedPtr<vkt::sr::TextureBinding> *)&resultSizeStr);
  this_00 = &(this->super_TextureQueryInstance).super_ShaderRenderCaseInstance.m_textures;
  std::
  vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
  ::clear(this_00);
  std::
  vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
  ::push_back(this_00,&textureBinding);
  de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr(&textureBinding);
  switch(((this->super_TextureQueryInstance).m_textureSpec)->type) {
  case TEXTURETYPE_1D:
  case TEXTURETYPE_2D:
  case TEXTURETYPE_3D:
  case TEXTURETYPE_CUBE_MAP:
    (this->m_expectedSize).m_data[2] = (this->m_testSize).expectedSize.m_data[2];
    *(undefined8 *)(this->m_expectedSize).m_data =
         *(undefined8 *)(this->m_testSize).expectedSize.m_data;
    break;
  case TEXTURETYPE_1D_ARRAY:
    iVar15 = (this->m_testSize).textureSize.m_data[2];
    (this->m_expectedSize).m_data[0] = (this->m_testSize).expectedSize.m_data[0];
    (this->m_expectedSize).m_data[1] = iVar15;
    (this->m_expectedSize).m_data[2] = 0;
    break;
  case TEXTURETYPE_2D_ARRAY:
    iVar15 = (this->m_testSize).textureSize.m_data[2];
    goto LAB_00621cc5;
  case TEXTURETYPE_CUBE_ARRAY:
    iVar15 = (this->m_testSize).textureSize.m_data[2] / 6;
LAB_00621cc5:
    *(undefined8 *)(this->m_expectedSize).m_data =
         *(undefined8 *)(this->m_testSize).expectedSize.m_data;
    (this->m_expectedSize).m_data[2] = iVar15;
  }
  TextureQueryInstance::render(&this->super_TextureQueryInstance);
  tcu::TextureLevel::getAccess
            ((ConstPixelBufferAccess *)&resultSizeStr,
             &(this->super_TextureQueryInstance).super_ShaderRenderCaseInstance.m_resultImage);
  tcu::ConstPixelBufferAccess::getPixelInt
            ((ConstPixelBufferAccess *)&output,(int)(ConstPixelBufferAccess *)&resultSizeStr,0,0);
  uVar14 = (ulong)((this->super_TextureQueryInstance).m_textureSpec)->type;
  if (uVar14 < 7) {
    dataType = *(DataType *)(&DAT_009c06a0 + uVar14 * 4);
  }
  else {
    dataType = TYPE_LAST;
  }
  uVar11 = glu::getDataTypeScalarSize(dataType);
  uVar3 = 0;
  if (0 < (int)uVar11) {
    uVar3 = uVar11;
  }
  uVar16 = (ulong)uVar3;
  uVar14 = 0xffffffffffffffff;
  do {
    if (uVar14 - uVar16 == -1) {
      _resultSizeStr = TVar4;
      std::__cxx11::ostringstream::ostringstream(local_8b8);
      std::operator<<((ostream *)local_8b8,"Passed");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&resultSizeStr,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_8b8);
      goto LAB_00621f06;
    }
    lVar12 = uVar14 + 1;
    uVar2 = uVar14 + 1;
    lVar9 = uVar14 + 1;
    uVar14 = uVar2;
  } while (output.m_data[lVar12] == (this->m_expectedSize).m_data[lVar9]);
  std::__cxx11::stringstream::stringstream((stringstream *)&resultSizeStr);
  if (uVar11 == 3) {
    tcu::Vector<int,_4>::toWidth<3>((Vector<int,_4> *)&local_1b0);
    tcu::operator<<(local_8b0,(Vector<int,_3> *)&local_1b0);
  }
  else if (uVar11 == 2) {
    tcu::Vector<int,_4>::toWidth<2>(&output);
    tcu::operator<<(local_8b0,(Vector<int,_2> *)&local_1b0);
  }
  else if (uVar11 == 1) {
    std::ostream::operator<<(local_8b0,output.m_data[0]);
  }
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = (TestLog *)TVar4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Result: ");
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)poVar1,(string *)&textureBinding);
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&textureBinding);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = (TestLog *)TVar4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Failed");
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  std::__cxx11::stringstream::~stringstream((stringstream *)&resultSizeStr);
  uVar16 = uVar2;
LAB_00621f06:
  _resultSizeStr = TVar4;
  std::__cxx11::ostringstream::ostringstream(local_8b8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&resultSizeStr,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_8b8);
  if ((long)uVar16 < (long)(int)uVar11) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&resultSizeStr,"Got unexpected result",(allocator<char> *)&local_1b0);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&resultSizeStr);
LAB_006216f8:
    std::__cxx11::string::~string((string *)&resultSizeStr);
  }
  else {
LAB_00621f60:
    tcu::TestStatus::incomplete();
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TextureSizeInstance::iterate (void)
{
	const TestSize testSizes[] =
	{
		{ tcu::IVec3(1, 2, 1),			0,		0,	tcu::IVec3(1, 2, 1)			},
		{ tcu::IVec3(1, 2, 1),			1,		0,	tcu::IVec3(1, 1, 1)			},

		{ tcu::IVec3(1, 3, 2),			0,		0,	tcu::IVec3(1, 3, 2)			},
		{ tcu::IVec3(1, 3, 2),			1,		0,	tcu::IVec3(1, 1, 1)			},

		{ tcu::IVec3(100, 31, 18),		0,		0,	tcu::IVec3(100, 31, 18)		},
		{ tcu::IVec3(100, 31, 18),		1,		0,	tcu::IVec3(50, 15, 9)		},
		{ tcu::IVec3(100, 31, 18),		2,		0,	tcu::IVec3(25, 7, 4)		},
		{ tcu::IVec3(100, 31, 18),		3,		0,	tcu::IVec3(12, 3, 2)		},
		{ tcu::IVec3(100, 31, 18),		4,		0,	tcu::IVec3(6, 1, 1)			},
		{ tcu::IVec3(100, 31, 18),		5,		0,	tcu::IVec3(3, 1, 1)			},
		{ tcu::IVec3(100, 31, 18),		6,		0,	tcu::IVec3(1, 1, 1)			},

		{ tcu::IVec3(100, 128, 32),		0,		0,	tcu::IVec3(100, 128, 32)	},
		{ tcu::IVec3(100, 128, 32),		1,		0,	tcu::IVec3(50, 64, 16)		},
		{ tcu::IVec3(100, 128, 32),		2,		0,	tcu::IVec3(25, 32, 8)		},
		{ tcu::IVec3(100, 128, 32),		3,		0,	tcu::IVec3(12, 16, 4)		},
		{ tcu::IVec3(100, 128, 32),		4,		0,	tcu::IVec3(6, 8, 2)			},
		{ tcu::IVec3(100, 128, 32),		5,		0,	tcu::IVec3(3, 4, 1)			},
		{ tcu::IVec3(100, 128, 32),		6,		0,	tcu::IVec3(1, 2, 1)			},
		{ tcu::IVec3(100, 128, 32),		7,		0,	tcu::IVec3(1, 1, 1)			},

		// pow 2
		{ tcu::IVec3(128, 64, 32),		0,		0,	tcu::IVec3(128, 64, 32)		},
		{ tcu::IVec3(128, 64, 32),		1,		0,	tcu::IVec3(64, 32, 16)		},
		{ tcu::IVec3(128, 64, 32),		2,		0,	tcu::IVec3(32, 16, 8)		},
		{ tcu::IVec3(128, 64, 32),		3,		0,	tcu::IVec3(16, 8, 4)		},
		{ tcu::IVec3(128, 64, 32),		4,		0,	tcu::IVec3(8, 4, 2)			},
		{ tcu::IVec3(128, 64, 32),		5,		0,	tcu::IVec3(4, 2, 1)			},
		{ tcu::IVec3(128, 64, 32),		6,		0,	tcu::IVec3(2, 1, 1)			},
		{ tcu::IVec3(128, 64, 32),		7,		0,	tcu::IVec3(1, 1, 1)			},

		// w == h
		{ tcu::IVec3(1, 1, 1),			0,		0,	tcu::IVec3(1, 1, 1)			},
		{ tcu::IVec3(64, 64, 64),		0,		0,	tcu::IVec3(64, 64, 64)		},
		{ tcu::IVec3(64, 64, 64),		1,		0,	tcu::IVec3(32, 32, 32)		},
		{ tcu::IVec3(64, 64, 64),		2,		0,	tcu::IVec3(16, 16, 16)		},
		{ tcu::IVec3(64, 64, 64),		3,		0,	tcu::IVec3(8, 8, 8)			},
		{ tcu::IVec3(64, 64, 64),		4,		0,	tcu::IVec3(4, 4, 4)			},

		// with lod base
		{ tcu::IVec3(100, 31, 18),		3,		1,	tcu::IVec3(6, 1, 1)			},
		{ tcu::IVec3(128, 64, 32),		3,		1,	tcu::IVec3(8, 4, 2)			},
		{ tcu::IVec3(64, 64, 64),		1,		1,	tcu::IVec3(16, 16, 16)		},

		// w == h and d % 6 == 0 (for cube array)
		{ tcu::IVec3(1, 1, 6),			0,		0,	tcu::IVec3(1, 1, 6)			},
		{ tcu::IVec3(32, 32, 12),		0,		0,	tcu::IVec3(32, 32, 12)		},
		{ tcu::IVec3(32, 32, 12),		0,		1,	tcu::IVec3(16, 16, 6)		},
		{ tcu::IVec3(32, 32, 12),		1,		0,	tcu::IVec3(16, 16, 6)		},
		{ tcu::IVec3(32, 32, 12),		2,		0,	tcu::IVec3(8, 8, 3)			},
		{ tcu::IVec3(32, 32, 12),		3,		0,	tcu::IVec3(4, 4, 1)			},
		{ tcu::IVec3(32, 32, 12),		4,		0,	tcu::IVec3(2, 2, 1)			},
		{ tcu::IVec3(32, 32, 12),		5,		0,	tcu::IVec3(1, 1, 1)			},
	};
	const int lastIterationIndex = DE_LENGTH_OF_ARRAY(testSizes) + 1;

	m_iterationCounter++;

	if (m_iterationCounter == lastIterationIndex)
		return tcu::TestStatus::pass("Pass");
	else
	{
		// set current test size
		m_testSize = testSizes[m_iterationCounter - 1];

		if (!testTextureSize())
			return tcu::TestStatus::fail("Got unexpected result");

		return tcu::TestStatus::incomplete();
	}
}